

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractTextDocumentLayout::Selection>::
emplace<QAbstractTextDocumentLayout::Selection_const&>
          (QMovableArrayOps<QAbstractTextDocumentLayout::Selection> *this,qsizetype i,
          Selection *args)

{
  Selection **ppSVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_70;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
           super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
        super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size == i) {
      qVar4 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::freeSpaceAtEnd
                        ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this);
      if (qVar4 == 0) goto LAB_00489feb;
      QAbstractTextDocumentLayout::Selection::Selection
                ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr +
                 (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size,args);
LAB_0048a0dd:
      pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0048a09c;
    }
LAB_00489feb:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::freeSpaceAtBegin
                        ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this);
      if (qVar4 != 0) {
        QAbstractTextDocumentLayout::Selection::Selection
                  ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                   super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr + -1,args);
        ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                   super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_0048a0dd;
      }
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractTextDocumentLayout::Selection::Selection((Selection *)&local_48,args);
  bVar5 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
          super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size != 0;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::detachAndGrow
            ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this,
             (uint)(i == 0 && bVar5),1,(Selection **)0x0,
             (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x0);
  if (i == 0 && bVar5) {
    QAbstractTextDocumentLayout::Selection::Selection
              ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr + -1,
               (Selection *)&local_48);
    ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
    *ppSVar1 = *ppSVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
              super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this,i
                       ,1);
    QAbstractTextDocumentLayout::Selection::Selection(local_70.displaceFrom,(Selection *)&local_48);
    local_70.displaceFrom = local_70.displaceFrom + 1;
    Inserter::~Inserter(&local_70);
  }
  QAbstractTextDocumentLayout::Selection::~Selection((Selection *)&local_48);
LAB_0048a09c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }